

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intsub_k64(jit_State *J)

{
  IRIns IVar1;
  TRef TVar2;
  uint64_t k;
  jit_State *J_local;
  
  IVar1 = (J->fold).right[1];
  if (IVar1 == (IRIns)0x0) {
    J_local._4_4_ = (uint)(J->fold).ins.field_0.op1;
  }
  else {
    (J->fold).ins.field_1.o = ')';
    TVar2 = lj_ir_kint64(J,((ulong)IVar1 ^ 0xffffffffffffffff) + 1);
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(SUB any KINT64)
LJFOLDF(simplify_intsub_k64)
{
  uint64_t k = ir_kint64(fright)->u64;
  if (k == 0)  /* i - 0 ==> i */
    return LEFTFOLD;
  fins->o = IR_ADD;  /* i - k ==> i + (-k) */
  fins->op2 = (IRRef1)lj_ir_kint64(J, ~k+1u);
  return RETRYFOLD;
}